

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  size_t pos_00;
  size_t sVar2;
  bool bVar3;
  size_t back;
  size_t pos;
  Entry *row_local;
  Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
  *this_local;
  Entry *result;
  
  pEVar1 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
           ::begin(&this->rows);
  bVar3 = false;
  if (pEVar1 <= row) {
    pEVar1 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
             ::end(&this->rows);
    bVar3 = row < pEVar1;
  }
  if (bVar3) {
    pEVar1 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
             ::begin(&this->rows);
    pos_00 = (long)row - (long)pEVar1 >> 6;
    Impl<0UL,_false>::erase(this,pos_00,row);
    pEVar1 = mv<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
                       (row);
    HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry::Entry
              (__return_storage_ptr__,pEVar1);
    sVar2 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
            ::size(&this->rows);
    sVar2 = sVar2 - 1;
    if (pos_00 != sVar2) {
      pEVar1 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
               ::operator[](&this->rows,sVar2);
      Impl<0UL,_false>::move(this,sVar2,pos_00,pEVar1);
      pEVar1 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
               ::operator[](&this->rows,sVar2);
      pEVar1 = mv<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
                         (pEVar1);
      HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry::operator=
                (row,pEVar1);
    }
    Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>::
    removeLast(&this->rows);
    return __return_storage_ptr__;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h"
             ,0x313,"&row >= rows.begin() && &row < rows.end()",
             "\"row is not a member of this table\"","row is not a member of this table");
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}